

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::writeSkeleton(Application *this,char *filename,Scene *scene)

{
  Skeleton *this_00;
  long lVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  int iVar5;
  string filenameNoExt;
  stringstream outfilename;
  char *local_1f8;
  char local_1e8 [16];
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)&local_1d8,filename,(allocator *)local_1b8);
  std::__cxx11::string::find((char *)&local_1d8,0x1e9541,0);
  std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_1d8);
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  p_Var3 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    iVar5 = 0;
    do {
      if (*(long *)(p_Var3 + 1) == 0) {
        lVar1 = 0;
      }
      else {
        lVar1 = __dynamic_cast(*(long *)(p_Var3 + 1),&DynamicScene::SceneObject::typeinfo,
                               &DynamicScene::Mesh::typeinfo,0);
      }
      if (lVar1 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_1d8,local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_skel.xml",9);
        this_00 = *(Skeleton **)(lVar1 + 0x168);
        std::__cxx11::stringbuf::str();
        DynamicScene::Skeleton::save(this_00,local_1f8);
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8);
        }
        iVar5 = iVar5 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  return;
}

Assistant:

void CMU462::Application::writeSkeleton(const char *filename,
                                        const DynamicScene::Scene *scene) {
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects) {
    DynamicScene::Mesh *mesh = dynamic_cast<DynamicScene::Mesh *>(object);
    if (mesh) {
      stringstream outfilename;
      outfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      mesh->skeleton->save(outfilename.str().c_str());
      meshID++;
    }
  }
}